

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_ring_node(REF_NODE ref_node)

{
  uint uVar1;
  double dVar2;
  double local_68;
  double local_60;
  double local_58;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL x;
  REF_DBL h;
  REF_DBL hh;
  REF_INT node;
  REF_NODE ref_node_local;
  
  hh._4_4_ = 0;
  do {
    if (ref_node->max <= hh._4_4_) {
      return 0;
    }
    if (((-1 < hh._4_4_) && (hh._4_4_ < ref_node->max)) && (-1 < ref_node->global[hh._4_4_])) {
      local_60 = ref_node->real[hh._4_4_ * 0xf];
      if (local_60 - 1.0 <= 0.0) {
        local_58 = -(local_60 - 1.0);
      }
      else {
        local_58 = local_60 - 1.0;
      }
      if (1.0 <= local_58 * 2.0) {
        local_68 = 1.0;
      }
      else {
        if (local_60 - 1.0 <= 0.0) {
          local_60 = -(local_60 - 1.0);
        }
        else {
          local_60 = local_60 - 1.0;
        }
        local_68 = local_60 * 2.0;
      }
      dVar2 = local_68 * 0.09000000000000001 + 0.01;
      uVar1 = ref_node_metric_form
                        (ref_node,hh._4_4_,1.0 / (dVar2 * dVar2),0.0,0.0,99.99999999999999,0.0,
                         99.99999999999999);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x78,"ref_metric_ring_node",(ulong)uVar1,"set node met");
        return uVar1;
      }
    }
    hh._4_4_ = hh._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_ring_node(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL hh;
  REF_DBL h = 0.01;
  REF_DBL x;
  each_ref_node_valid_node(ref_node, node) {
    x = ref_node_xyz(ref_node, 0, node);
    hh = h + (0.1 - h) * MIN(2 * ABS(x - 1.0), 1);
    RSS(ref_node_metric_form(ref_node, node, 1.0 / (hh * hh), 0, 0,
                             1.0 / (0.1 * 0.1), 0, 1.0 / (0.1 * 0.1)),
        "set node met");
  }

  return REF_SUCCESS;
}